

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

void save_cursor(Terminal *term,_Bool save)

{
  _Bool _Var1;
  wchar_t wVar2;
  pos pVar3;
  wchar_t wVar4;
  undefined7 in_register_00000031;
  char cVar5;
  
  if ((int)CONCAT71(in_register_00000031,save) != 0) {
    term->savecurs = term->curs;
    term->save_attr = term->curr_attr;
    term->save_truecolour = term->curr_truecolour;
    term->save_cset = term->cset;
    term->save_utf = term->utf;
    term->save_wnext = term->wrapnext;
    term->save_csattr = term->cset_attr[term->cset];
    term->save_sco_acs = term->sco_acs;
    return;
  }
  pVar3 = term->savecurs;
  term->curs = pVar3;
  wVar2 = term->cols;
  wVar4 = pVar3.x;
  if (wVar2 <= wVar4) {
    wVar4 = wVar2 + L'\xffffffff';
    (term->curs).x = wVar4;
  }
  if (term->rows <= pVar3.y) {
    (term->curs).y = term->rows + L'\xffffffff';
  }
  term->curr_attr = term->save_attr;
  term->curr_truecolour = term->save_truecolour;
  term->cset = term->save_cset;
  term->utf = term->save_utf;
  _Var1 = term->save_wnext;
  cVar5 = '\0';
  if (wVar2 + L'\xffffffff' <= wVar4) {
    cVar5 = _Var1;
  }
  if (_Var1 == false) {
    cVar5 = _Var1;
  }
  term->wrapnext = (_Bool)cVar5;
  term->cset_attr[term->save_cset] = term->save_csattr;
  term->sco_acs = term->save_sco_acs;
  set_erase_char(term);
  return;
}

Assistant:

static void save_cursor(Terminal *term, bool save)
{
    if (save) {
        term->savecurs = term->curs;
        term->save_attr = term->curr_attr;
        term->save_truecolour = term->curr_truecolour;
        term->save_cset = term->cset;
        term->save_utf = term->utf;
        term->save_wnext = term->wrapnext;
        term->save_csattr = term->cset_attr[term->cset];
        term->save_sco_acs = term->sco_acs;
    } else {
        term->curs = term->savecurs;
        /* Make sure the window hasn't shrunk since the save */
        if (term->curs.x >= term->cols)
            term->curs.x = term->cols - 1;
        if (term->curs.y >= term->rows)
            term->curs.y = term->rows - 1;

        term->curr_attr = term->save_attr;
        term->curr_truecolour = term->save_truecolour;
        term->cset = term->save_cset;
        term->utf = term->save_utf;
        term->wrapnext = term->save_wnext;
        /*
         * wrapnext might reset to False if the x position is no
         * longer at the rightmost edge.
         */
        if (term->wrapnext && term->curs.x < term->cols-1)
            term->wrapnext = false;
        term->cset_attr[term->cset] = term->save_csattr;
        term->sco_acs = term->save_sco_acs;
        set_erase_char(term);
    }
}